

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_controller.h
# Opt level: O3

void __thiscall
r_exec::HLPController::_store_evidence<r_exec::HLPController::EEntry>
          (HLPController *this,Cache<r_exec::HLPController::EEntry> *cache,_Fact *evidence)

{
  list<r_exec::HLPController::EEntry> *this_00;
  pointer pcVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  const_iterator cVar5;
  EEntry e;
  const_iterator local_60;
  EEntry local_50;
  
  EEntry::EEntry(&local_50,evidence);
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)cache);
  if (iVar3 == 0) {
    uVar4 = (*Now)();
    this_00 = &cache->evidences;
    local_60.super__iterator._cell = (cache->evidences).used_cells_head;
    cVar5._list = this_00;
    cVar5.super__iterator._cell = local_60.super__iterator._cell;
    local_60._list = this_00;
    if (local_60.super__iterator._cell != -1) {
      do {
        pcVar1 = ((cVar5._list)->cells).
                 super__Vector_base<r_code::list<r_exec::HLPController::EEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::EEntry>::cell>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar2 = (**(code **)(**(long **)&pcVar1[cVar5.super__iterator._cell._cell].data.evidence +
                            0x70))();
        if ((bVar2 | pcVar1[cVar5.super__iterator._cell._cell].data.before < uVar4) == 1) {
          cVar5 = r_code::list<r_exec::HLPController::EEntry>::erase(this_00,&local_60);
          local_60._list = cVar5._list;
        }
        else {
          cVar5._list = local_60._list;
          cVar5.super__iterator._cell =
               ((local_60._list)->cells).
               super__Vector_base<r_code::list<r_exec::HLPController::EEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::EEntry>::cell>_>
               ._M_impl.super__Vector_impl_data._M_start[local_60.super__iterator._cell].next;
        }
        local_60.super__iterator = cVar5.super__iterator._cell;
      } while (local_60.super__iterator._cell != -1);
    }
    r_code::list<r_exec::HLPController::EEntry>::push_front(this_00,&local_50);
    pthread_mutex_unlock((pthread_mutex_t *)cache);
    if (local_50.evidence.object != (_Object *)0x0) {
      LOCK();
      ((local_50.evidence.object)->refCount).super___atomic_base<long>._M_i =
           ((local_50.evidence.object)->refCount).super___atomic_base<long>._M_i + -1;
      UNLOCK();
      if (((local_50.evidence.object)->refCount).super___atomic_base<long>._M_i < 1) {
        (*(local_50.evidence.object)->_vptr__Object[1])();
      }
    }
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void _store_evidence(Cache<E> *cache, _Fact *evidence)
    {
        E e(evidence);
        std::lock_guard<std::mutex> guard(cache->mutex);
        uint64_t now = r_exec::Now();
        typename r_code::list<E>::const_iterator _e;

        for (_e = cache->evidences.begin(); _e != cache->evidences.end();) {
            if ((*_e).is_too_old(now)) { // garbage collection.
                _e = cache->evidences.erase(_e);
            } else {
                ++_e;
            }
        }

        cache->evidences.push_front(e);
    }